

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageLabelDocumentHelper::getLabelsForPageRange
          (QPDFPageLabelDocumentHelper *this,longlong start_idx,longlong end_idx,
          longlong new_start_idx,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_labels)

{
  bool bVar1;
  __type_conflict1 _Var2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  QPDFObjectHandle label;
  QPDFObjectHandle last;
  QPDFObjectHandle last_idx;
  allocator<char> local_216;
  allocator<char> local_215;
  allocator<char> local_214;
  allocator<char> local_213;
  allocator<char> local_212;
  allocator<char> local_211;
  string local_210 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffdf8;
  undefined1 local_1f0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  QPDFPageLabelDocumentHelper *local_1d0;
  QPDFObjectHandle local_1c8 [2];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  string local_198;
  longlong local_178;
  QPDFObjectHandle local_170;
  QPDFObjectHandle local_160;
  QPDFObjectHandle local_150;
  QPDFObjectHandle local_140;
  QPDFObjectHandle local_130 [2];
  QPDFObjectHandle local_110;
  QPDFObjectHandle local_100;
  string local_f0 [32];
  string local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50;
  
  local_1d0 = this;
  local_178 = end_idx;
  getLabelForPage((QPDFPageLabelDocumentHelper *)local_1f0,(longlong)this);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_1f0);
  if (bVar1) {
    QPDFObjectHandle::newDictionary();
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1f0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffdf8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_210,"/St",(allocator<char> *)&local_198);
    QPDFObjectHandle::newInteger((longlong)in_stack_fffffffffffffdf8._M_pi);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_1f0,(string *)local_210,local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1c8[0].super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_210);
  }
  uVar7 = (long)(new_labels->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(new_labels->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (1 < uVar7) {
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       (new_labels,uVar7 - 1);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_1f0 + 0x10),p_Var3);
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       (new_labels,uVar7 - 2);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1a8,p_Var3);
    bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_1a8);
    if ((bVar1) &&
       (bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_1f0 + 0x10)), bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"/S",&local_211);
      QPDFObjectHandle::getKey(&local_100,(string *)local_1f0);
      QPDFObjectHandle::unparse_abi_cxx11_((string *)local_210,&local_100);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"/S",&local_212);
      QPDFObjectHandle::getKey(&local_110,(string *)(local_1f0 + 0x10));
      QPDFObjectHandle::unparse_abi_cxx11_(&local_198,&local_110);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_210,&local_198);
      if (_Var2) {
        std::__cxx11::string::string<std::allocator<char>>(local_f0,"/P",&local_213);
        QPDFObjectHandle::getKey(&local_140,(string *)local_1f0);
        QPDFObjectHandle::unparse_abi_cxx11_(&local_d0,&local_140);
        std::__cxx11::string::string<std::allocator<char>>(local_70,"/P",&local_214);
        QPDFObjectHandle::getKey(&local_150,(string *)(local_1f0 + 0x10));
        QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_150);
        _Var2 = std::operator==(&local_d0,&local_50);
        if (_Var2) {
          std::__cxx11::string::string<std::allocator<char>>(local_90,"/St",&local_215);
          QPDFObjectHandle::getKey(&local_160,(string *)local_1f0);
          bVar1 = QPDFObjectHandle::isInteger(&local_160);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>(local_b0,"/St",&local_216);
            QPDFObjectHandle::getKey(&local_170,(string *)(local_1f0 + 0x10));
            bVar1 = QPDFObjectHandle::isInteger(&local_170);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_170.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__cxx11::string::~string(local_b0);
          }
          else {
            bVar1 = false;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_160.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string(local_90);
        }
        else {
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_150.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_140.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_f0);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_198);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_110.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string(local_210);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_100.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_1c8);
      if (bVar1 != false) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_210,"/St",(allocator<char> *)&local_d0);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_198,(string *)local_1f0);
        lVar4 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_198);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c8,"/St",(allocator<char> *)local_f0);
        QPDFObjectHandle::getKey(local_130,(string *)(local_1f0 + 0x10));
        lVar5 = QPDFObjectHandle::getIntValue(local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_130[0].super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
        std::__cxx11::string::~string(local_210);
        lVar6 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_1a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8);
        if (lVar4 - lVar5 == new_start_idx - lVar6) goto LAB_001a4fdc;
        goto LAB_001a4fab;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8);
  }
LAB_001a4fab:
  QPDFObjectHandle::newInteger((longlong)in_stack_fffffffffffffdf8._M_pi);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (new_labels,(QPDFObjectHandle *)local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffdf8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            (new_labels,(value_type *)local_1f0);
LAB_001a4fdc:
  while (start_idx < local_178) {
    start_idx = start_idx + 1;
    bVar1 = QPDFNumberTreeObjectHelper::hasIndex
                      ((((local_1d0->m).
                         super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->labels).
                       super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,start_idx);
    if (bVar1) {
      getLabelForPage((QPDFPageLabelDocumentHelper *)local_210,(longlong)local_1d0);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1f0,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_210);
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffdf8);
      if (bVar1) {
        QPDFObjectHandle::newInteger((longlong)in_stack_fffffffffffffdf8._M_pi);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
        emplace_back<QPDFObjectHandle>(new_labels,(QPDFObjectHandle *)local_210);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffdf8);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (new_labels,(value_type *)local_1f0);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f0 + 8));
  return;
}

Assistant:

void
QPDFPageLabelDocumentHelper::getLabelsForPageRange(
    long long start_idx,
    long long end_idx,
    long long new_start_idx,
    std::vector<QPDFObjectHandle>& new_labels)
{
    // Start off with a suitable label for the first page. For every remaining page, if that page
    // has an explicit entry, copy it. Otherwise, let the subsequent page just sequence from the
    // prior entry. If there is no entry for the first page, fabricate one that would match how the
    // page would look in a new file in which it also didn't have an explicit label.
    QPDFObjectHandle label = getLabelForPage(start_idx);
    if (label.isNull()) {
        label = QPDFObjectHandle::newDictionary();
        label.replaceKey("/St", QPDFObjectHandle::newInteger(1 + new_start_idx));
    }
    // See if the new label is redundant based on the previous entry in the vector. If so, don't add
    // it.
    size_t size = new_labels.size();
    bool skip_first = false;
    if (size >= 2) {
        QPDFObjectHandle last = new_labels.at(size - 1);
        QPDFObjectHandle last_idx = new_labels.at(size - 2);
        if (last_idx.isInteger() && last.isDictionary() &&
            (label.getKey("/S").unparse() == last.getKey("/S").unparse()) &&
            (label.getKey("/P").unparse() == last.getKey("/P").unparse()) &&
            label.getKey("/St").isInteger() && last.getKey("/St").isInteger()) {
            long long int st_delta =
                label.getKey("/St").getIntValue() - last.getKey("/St").getIntValue();
            long long int idx_delta = new_start_idx - last_idx.getIntValue();
            if (st_delta == idx_delta) {
                QTC::TC("qpdf", "QPDFPageLabelDocumentHelper skip first");
                skip_first = true;
            }
        }
    }
    if (!skip_first) {
        new_labels.push_back(QPDFObjectHandle::newInteger(new_start_idx));
        new_labels.push_back(label);
    }

    long long int idx_offset = new_start_idx - start_idx;
    for (long long i = start_idx + 1; i <= end_idx; ++i) {
        if (m->labels->hasIndex(i) && (label = getLabelForPage(i)).isDictionary()) {
            new_labels.push_back(QPDFObjectHandle::newInteger(i + idx_offset));
            new_labels.push_back(label);
        }
    }
}